

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON_String __thiscall ON_String::ToUTF8(ON_String *this,char *buffer,int buffer_length)

{
  int iVar1;
  uint *sUTF32;
  bool bVar2;
  Encoding EVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint error_status;
  ON_UnicodeShortCodePoint u;
  ON_Big5CodePoint big5_cp;
  ON_SimpleArray<unsigned_int> utf32;
  
  if (buffer != (char *)0x0) {
    if (buffer_length == -1) {
      buffer_length = Length(buffer);
    }
    if (0 < buffer_length) {
      utf32._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
      utf32.m_a = (uint *)0x0;
      utf32.m_count = 0;
      utf32.m_capacity = 0;
      EVar3 = ProbableEncoding(buffer,buffer_length);
      if (EVar3 - ASCII < 2) {
        ON_String(this,buffer,buffer_length);
      }
      else if (EVar3 == SloppyUTF8) {
        ON_String((ON_String *)&big5_cp,buffer,buffer_length);
        ON_wString::ON_wString((ON_wString *)&error_status,(ON_String *)&big5_cp);
        ON_String(this,(ON_wString *)&error_status);
        ON_wString::~ON_wString((ON_wString *)&error_status);
        ~ON_String((ON_String *)&big5_cp);
      }
      else {
        uVar5 = 0;
        if (EVar3 == BIG5andASCII) {
          if (-1 < (long)utf32._16_8_) {
            utf32._16_8_ = utf32._16_8_ & 0xffffffff00000000;
          }
          ON_SimpleArray<unsigned_int>::Reserve(&utf32,(ulong)(uint)buffer_length);
          iVar6 = 0;
          for (uVar5 = 0; (int)uVar5 < buffer_length; uVar5 = uVar5 + iVar1) {
            if (buffer[uVar5] < '\0') {
              if (buffer_length < (int)(uVar5 + 2)) {
LAB_005c1a84:
                error_status = 0xfffd;
                ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
                iVar6 = iVar6 + 1;
                goto LAB_005c1a9e;
              }
              big5_cp = ON_Big5CodePoint::Error;
              pcVar4 = ON_Big5CodePoint::Decode(buffer + uVar5,2,false,false,&big5_cp);
              if ((pcVar4 != buffer + uVar5 + 2) ||
                 (bVar2 = ON_Big5CodePoint::IsValid(&big5_cp,false,false), !bVar2))
              goto LAB_005c1a84;
              u = ON_UnicodeShortCodePoint::CreateFromBig5
                            (&big5_cp,ON_UnicodeShortCodePoint::ReplacementCharacter);
              bVar2 = ON_UnicodeShortCodePoint::IsReplacementCharacter(&u);
              error_status = ON_UnicodeShortCodePoint::UnicodeCodePoint(&u);
              ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
              iVar6 = iVar6 + (uint)bVar2;
              iVar1 = 2;
            }
            else {
              error_status = (int)buffer[uVar5];
              ON_SimpleArray<unsigned_int>::Append(&utf32,&error_status);
LAB_005c1a9e:
              iVar1 = 1;
            }
          }
          uVar5 = iVar6 * 2;
        }
        if ((utf32.m_count != 0) && (uVar5 <= (uint)utf32.m_count)) {
          error_status = 0;
          uVar5 = ON_ConvertUTF32ToUTF8
                            (0,utf32.m_a,utf32.m_count,(char *)0x0,0,&error_status,0xffffffff,0xfffd
                             ,(ON__UINT32 **)0x0);
          if (0 < (int)uVar5) {
            error_status = 0;
            ON_String(this);
            ReserveArray(this,(ulong)uVar5);
            SetLength(this,(ulong)uVar5);
            sUTF32 = utf32.m_a;
            iVar6 = utf32.m_count;
            pcVar4 = Array(this);
            ON_ConvertUTF32ToUTF8
                      (0,sUTF32,iVar6,pcVar4,uVar5,&error_status,0xffffffff,0xfffd,
                       (ON__UINT32 **)0x0);
            goto LAB_005c1bd0;
          }
        }
        ON_String(this,&EmptyString);
      }
LAB_005c1bd0:
      ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&utf32);
      return (ON_String)(char *)this;
    }
  }
  ON_String(this,&EmptyString);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToUTF8(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::EmptyString;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0)
    return ON_String::EmptyString;

  unsigned bad_utf32_count = 0;
  ON_SimpleArray<ON__UINT32> utf32;

  const ON_String::Encoding e = ON_String::ProbableEncoding(buffer, buffer_length);
  switch (e)
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::UTF8:
    return ON_String(buffer, buffer_length);
    break;

  case ON_String::Encoding::SloppyUTF8:
    // ON_String -> ON_wString cleans up the slop.
    // ON_wString -> ON_String converts the wchar_t UTF-X encoding to UTF-8.
    return ON_String(ON_wString(ON_String(buffer, buffer_length)));
    break;

  case ON_String::Encoding::BIG5andASCII:
    bad_utf32_count = Internal_Big5ToUTF32(buffer, buffer_length, utf32);
    break;

  default:
    break;
  }

  const unsigned utf32_count = utf32.UnsignedCount();
  if (utf32_count > 0 && utf32_count >= 2* bad_utf32_count)
  {
    unsigned int error_status = 0;
    const unsigned int error_mask = 0xFFFFFFFFu;
    const int utf8_count = ON_ConvertUTF32ToUTF8(
      false, // bTestByteOrder,
      utf32.Array(),
      utf32.Count(),
      nullptr, // char* sUTF8,
      0, // int sUTF8_count,
      &error_status,
      error_mask,
      ON_UnicodeCodePoint::ON_ReplacementCharacter,
      nullptr //const ON__UINT32 * *sNextUTF32
    );
    if (utf8_count > 0)
    {
      error_status = 0;
      ON_String utf8;
      utf8.ReserveArray(utf8_count);
      utf8.SetLength(utf8_count);
      ON_ConvertUTF32ToUTF8(
        false, // bTestByteOrder,
        utf32.Array(),
        utf32.Count(),
        utf8.Array(),
        utf8_count,
        &error_status,
        error_mask,
        ON_UnicodeCodePoint::ON_ReplacementCharacter,
        nullptr //const ON__UINT32 * *sNextUTF32
      );
      return utf8;
    }
  }

  return ON_String::EmptyString;
}